

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O3

MinMax<signed_char> Omega_h::get_minmax<signed_char>(CommPtr *comm,Read<signed_char> *a)

{
  int *piVar1;
  Alloc *pAVar2;
  char cVar3;
  MinMax<signed_char> MVar4;
  Read<signed_char> local_60;
  CommPtr local_50;
  Read<signed_char> local_40;
  CommPtr local_30;
  
  local_30.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_30.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_30.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_30.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_30.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_40.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
  if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_40.write_.shared_alloc_.alloc =
           (Alloc *)((local_40.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_40.write_.shared_alloc_.alloc)->use_count =
           (local_40.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_40.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
  MVar4.min = get_min<signed_char>(&local_30,&local_40);
  local_50.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_50.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_50.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_50.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_50.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_60.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_60.write_.shared_alloc_.alloc =
           (Alloc *)((local_60.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.write_.shared_alloc_.alloc)->use_count =
           (local_60.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_60.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
  cVar3 = get_max<signed_char>(&local_50,&local_60);
  pAVar2 = local_60.write_.shared_alloc_.alloc;
  if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_60.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  if (local_50.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  pAVar2 = local_40.write_.shared_alloc_.alloc;
  if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
      local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_40.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  if (local_30.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  MVar4.max = cVar3;
  return MVar4;
}

Assistant:

MinMax<T> get_minmax(CommPtr comm, Read<T> a) {
  return {get_min(comm, a), get_max(comm, a)};
}